

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_explain_analyze.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PhysicalExplainAnalyze::GetData
          (PhysicalExplainAnalyze *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  pointer pGVar1;
  Value VStack_78;
  string local_38;
  
  pGVar1 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalOperator).sink_state);
  Value::Value(&VStack_78,"analyzed_plan");
  DataChunk::SetValue(chunk,0,0,&VStack_78);
  Value::~Value(&VStack_78);
  ::std::__cxx11::string::string((string *)&local_38,(string *)(pGVar1 + 1));
  Value::Value(&VStack_78,&local_38);
  DataChunk::SetValue(chunk,1,0,&VStack_78);
  Value::~Value(&VStack_78);
  ::std::__cxx11::string::~string((string *)&local_38);
  chunk->count = 1;
  return FINISHED;
}

Assistant:

SourceResultType PhysicalExplainAnalyze::GetData(ExecutionContext &context, DataChunk &chunk,
                                                 OperatorSourceInput &input) const {
	auto &gstate = sink_state->Cast<ExplainAnalyzeStateGlobalState>();

	chunk.SetValue(0, 0, Value("analyzed_plan"));
	chunk.SetValue(1, 0, Value(gstate.analyzed_plan));
	chunk.SetCardinality(1);

	return SourceResultType::FINISHED;
}